

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O1

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  char *pcVar2;
  cmDependInformation *info;
  FILE *__stream;
  bool bVar3;
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  cmLBDepend md;
  allocator local_279;
  undefined1 local_278 [32];
  _Base_ptr local_258;
  size_t local_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    local_248._0_8_ = (cmMakefile *)(local_248 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_248);
    if ((cmMakefile *)local_248._0_8_ != (cmMakefile *)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,(ulong)(local_238 + 1));
    }
    return false;
  }
  std::__cxx11::string::_M_assign((string *)&this->File);
  std::__cxx11::string::_M_assign((string *)&this->OutputFile);
  cmLBDepend::cmLBDepend((cmLBDepend *)local_248);
  cmLBDepend::SetMakefile((cmLBDepend *)local_248,(this->super_cmCommand).Makefile);
  pcVar2 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)local_278,pcVar2,&local_279);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff68,(value_type *)local_278);
  pcVar1 = local_278 + 0x10;
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  info = cmLBDepend::GetDependInformation
                   ((cmLBDepend *)local_248,(this->File)._M_dataplus._M_p,(char *)0x0);
  cmLBDepend::GenerateDependInformation((cmLBDepend *)local_248,info);
  if (info != (cmDependInformation *)0x0) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&this->OutputFile,"w");
    if (__stream == (FILE *)0x0) {
      local_278._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,"Can not open output file: ","");
      std::__cxx11::string::_M_append(local_278,(ulong)(this->OutputFile)._M_dataplus._M_p);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_278);
      if ((pointer)local_278._0_8_ != pcVar1) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
    }
    else {
      local_278._24_8_ = local_278 + 8;
      local_278._8_4_ = _S_red;
      local_278._16_8_ = 0;
      local_250 = 0;
      local_258 = (_Base_ptr)local_278._24_8_;
      ListDependencies(this,info,(FILE *)__stream,
                       (set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                        *)local_278);
      fclose(__stream);
      std::
      _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::~_Rb_tree((_Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                   *)local_278);
    }
    if (__stream == (FILE *)0x0) {
      bVar3 = false;
      goto LAB_002daf40;
    }
  }
  bVar3 = true;
LAB_002daf40:
  cmLBDepend::~cmLBDepend((cmLBDepend *)local_248);
  return bVar3;
}

Assistant:

bool cmOutputRequiredFilesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation* info = md.FindDependencies(this->File.c_str());
  if (info) {
    // write them out
    FILE* fout = cmsys::SystemTools::Fopen(this->OutputFile, "w");
    if (!fout) {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
    }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info, fout, &visited);
    fclose(fout);
  }

  return true;
}